

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_render_scanline(PWorker worker,TCoord ey,TPos x1,TCoord y1,TPos x2,TCoord y2)

{
  long ex;
  ulong uVar1;
  long local_a0;
  TCoord rem;
  TCoord lift;
  long lStack_88;
  int incr;
  TPos dx;
  TPos p;
  TCoord mod;
  TCoord delta;
  TCoord dy;
  TCoord first;
  TCoord fx2;
  TCoord fx1;
  TCoord ex2;
  TCoord ex1;
  TCoord y2_local;
  TPos x2_local;
  TCoord y1_local;
  TPos x1_local;
  TCoord ey_local;
  PWorker worker_local;
  
  ex = x2 >> 8;
  if (y1 == y2) {
    gray_set_cell(worker,ex,ey);
  }
  else {
    fx2 = x1 & 0xff;
    x2_local = y1;
    if (x1 >> 8 != ex) {
      lStack_88 = x2 - x1;
      if (lStack_88 < 1) {
        dy = 0;
        lift._4_4_ = -1;
        lStack_88 = -lStack_88;
        uVar1 = fx2;
      }
      else {
        dy = 0x100;
        lift._4_4_ = 1;
        uVar1 = 0x100 - fx2;
      }
      dx = uVar1 * (y2 - y1);
      mod = dx / lStack_88;
      p = dx % lStack_88;
      if (p < 0) {
        mod = mod + -1;
        p = lStack_88 + p;
      }
      worker->area = (fx2 + dy) * mod + worker->area;
      worker->cover = worker->cover + (int)mod;
      x2_local = mod + y1;
      ex2 = (long)lift._4_4_ + (x1 >> 8);
      gray_set_cell(worker,ex2,ey);
      if (ex2 != ex) {
        local_a0 = (y2 - y1) * 0x100;
        rem = local_a0 / lStack_88;
        local_a0 = local_a0 % lStack_88;
        if (local_a0 < 0) {
          rem = rem + -1;
          local_a0 = lStack_88 + local_a0;
        }
        do {
          mod = rem;
          p = local_a0 + p;
          if (lStack_88 <= p) {
            p = p - lStack_88;
            mod = rem + 1;
          }
          worker->area = mod * 0x100 + worker->area;
          worker->cover = worker->cover + (int)mod;
          x2_local = mod + x2_local;
          ex2 = lift._4_4_ + ex2;
          gray_set_cell(worker,ex2,ey);
        } while (ex2 != ex);
      }
      fx2 = 0x100 - dy;
    }
    worker->area = (fx2 + (x2 & 0xffU)) * (y2 - x2_local) + worker->area;
    worker->cover = worker->cover + (int)(y2 - x2_local);
  }
  return;
}

Assistant:

static void
  gray_render_scanline( RAS_ARG_ TCoord  ey,
                                 TPos    x1,
                                 TCoord  y1,
                                 TPos    x2,
                                 TCoord  y2 )
  {
    TCoord  ex1, ex2, fx1, fx2, first, dy, delta, mod;
    TPos    p, dx;
    int     incr;


    ex1 = TRUNC( x1 );
    ex2 = TRUNC( x2 );

    /* trivial case.  Happens often */
    if ( y1 == y2 )
    {
      gray_set_cell( RAS_VAR_ ex2, ey );
      return;
    }

    fx1   = FRACT( x1 );
    fx2   = FRACT( x2 );

    /* everything is located in a single cell.  That is easy! */
    /*                                                        */
    if ( ex1 == ex2 )
      goto End;

    /* ok, we'll have to render a run of adjacent cells on the same */
    /* scanline...                                                  */
    /*                                                              */
    dx = x2 - x1;
    dy = y2 - y1;

    if ( dx > 0 )
    {
      p     = ( ONE_PIXEL - fx1 ) * dy;
      first = ONE_PIXEL;
      incr  = 1;
    } else {
      p     = fx1 * dy;
      first = 0;
      incr  = -1;
      dx    = -dx;
    }

    PVG_FT_DIV_MOD( TCoord, p, dx, delta, mod );

    ras.area  += (TArea)( fx1 + first ) * delta;
    ras.cover += delta;
    y1        += delta;
    ex1       += incr;
    gray_set_cell( RAS_VAR_ ex1, ey );

    if ( ex1 != ex2 )
    {
      TCoord  lift, rem;


      p = ONE_PIXEL * dy;
      PVG_FT_DIV_MOD( TCoord, p, dx, lift, rem );

      do
      {
        delta = lift;
        mod  += rem;
        if ( mod >= (TCoord)dx )
        {
          mod -= (TCoord)dx;
          delta++;
        }

        ras.area  += (TArea)( ONE_PIXEL * delta );
        ras.cover += delta;
        y1        += delta;
        ex1       += incr;
        gray_set_cell( RAS_VAR_ ex1, ey );
      } while ( ex1 != ex2 );
    }
    fx1 = ONE_PIXEL - first;

  End:
    dy = y2 - y1;

    ras.area  += (TArea)( ( fx1 + fx2 ) * dy );
    ras.cover += dy;
  }